

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tt_GetGlyphShape(nk_tt_fontinfo *info,nk_allocator *alloc,int glyph_index,
                       nk_tt_vertex **pvertices)

{
  short sVar1;
  byte *pbVar2;
  nk_ushort nVar3;
  nk_short nVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  nk_byte *p;
  nk_tt_vertex *pnVar8;
  float fVar9;
  float fVar10;
  int local_114;
  int local_110;
  short y_1;
  short x_1;
  nk_tt_vertex *v;
  float n_1;
  float m_1;
  float mtx [6];
  nk_tt_vertex *tmp;
  nk_tt_vertex *comp_verts;
  int local_c8;
  int i_1;
  int comp_num_verts;
  nk_ushort gidx;
  nk_ushort flags_1;
  nk_byte *comp;
  int more;
  nk_short dy;
  nk_short dx;
  nk_byte *points;
  nk_int scy;
  nk_int scx;
  nk_int sy;
  nk_int sx;
  nk_int cy;
  nk_int cx;
  nk_int y;
  nk_int x;
  nk_int start_off;
  nk_int off;
  nk_int was_off;
  nk_int next_move;
  nk_int n;
  nk_int m;
  nk_int j;
  nk_int i;
  nk_int ins;
  nk_byte flagcount;
  int iStack_5c;
  nk_byte flags;
  int g;
  int num_vertices;
  nk_tt_vertex *vertices;
  nk_byte *data;
  nk_byte *endPtsOfContours;
  nk_tt_vertex **ppnStack_38;
  nk_short numberOfContours;
  nk_tt_vertex **pvertices_local;
  nk_allocator *pnStack_28;
  int glyph_index_local;
  nk_allocator *alloc_local;
  nk_tt_fontinfo *info_local;
  
  vertices = (nk_tt_vertex *)info->data;
  _g = (nk_tt_vertex *)0x0;
  iStack_5c = 0;
  ppnStack_38 = pvertices;
  pvertices_local._4_4_ = glyph_index;
  pnStack_28 = alloc;
  alloc_local = (nk_allocator *)info;
  ins = nk_tt__GetGlyfOffset(info,glyph_index);
  *ppnStack_38 = (nk_tt_vertex *)0x0;
  if (ins < 0) {
    info_local._4_4_ = 0;
  }
  else {
    endPtsOfContours._6_2_ = nk_ttSHORT((nk_byte *)((long)&vertices->x + (long)ins));
    if (endPtsOfContours._6_2_ < 1) {
      if (endPtsOfContours._6_2_ == -1) {
        _comp_num_verts = (nk_byte *)((long)&vertices[1].x + (long)ins);
        iStack_5c = 0;
        _g = (nk_tt_vertex *)0x0;
        endPtsOfContours._6_2_ = 0xffff;
        comp._0_4_ = 1;
        while ((uint)comp != 0) {
          local_c8 = 0;
          tmp = (nk_tt_vertex *)0x0;
          n_1 = 1.0;
          m_1 = 0.0;
          mtx[0] = 0.0;
          mtx[1] = 1.0;
          i_1._2_2_ = nk_ttSHORT(_comp_num_verts);
          _comp_num_verts = _comp_num_verts + 2;
          i_1._0_2_ = nk_ttSHORT(_comp_num_verts);
          p = _comp_num_verts + 2;
          if ((i_1._2_2_ & 2) == 0) {
            _comp_num_verts = p;
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                          ,0x2239,
                          "int nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *, struct nk_allocator *, int, struct nk_tt_vertex **)"
                         );
          }
          if ((i_1._2_2_ & 1) == 0) {
            iVar5 = (int)(char)*p;
            iVar6 = (int)(char)_comp_num_verts[3];
            _comp_num_verts = _comp_num_verts + 4;
          }
          else {
            _comp_num_verts = p;
            nVar4 = nk_ttSHORT(p);
            iVar5 = (int)nVar4;
            _comp_num_verts = _comp_num_verts + 2;
            nVar4 = nk_ttSHORT(_comp_num_verts);
            iVar6 = (int)nVar4;
            _comp_num_verts = _comp_num_verts + 2;
          }
          mtx[3] = (float)iVar6;
          mtx[2] = (float)iVar5;
          if ((i_1._2_2_ & 8) == 0) {
            if ((i_1._2_2_ & 0x40) == 0) {
              if ((i_1._2_2_ & 0x80) != 0) {
                nVar4 = nk_ttSHORT(_comp_num_verts);
                n_1 = (float)(int)nVar4 / 16384.0;
                _comp_num_verts = _comp_num_verts + 2;
                nVar4 = nk_ttSHORT(_comp_num_verts);
                m_1 = (float)(int)nVar4 / 16384.0;
                _comp_num_verts = _comp_num_verts + 2;
                nVar4 = nk_ttSHORT(_comp_num_verts);
                mtx[0] = (float)(int)nVar4 / 16384.0;
                _comp_num_verts = _comp_num_verts + 2;
                nVar4 = nk_ttSHORT(_comp_num_verts);
                mtx[1] = (float)(int)nVar4 / 16384.0;
                _comp_num_verts = _comp_num_verts + 2;
              }
            }
            else {
              nVar4 = nk_ttSHORT(_comp_num_verts);
              n_1 = (float)(int)nVar4 / 16384.0;
              _comp_num_verts = _comp_num_verts + 2;
              m_1 = 0.0;
              nVar4 = nk_ttSHORT(_comp_num_verts);
              mtx[1] = (float)(int)nVar4 / 16384.0;
              mtx[0] = 0.0;
              _comp_num_verts = _comp_num_verts + 2;
            }
          }
          else {
            nVar4 = nk_ttSHORT(_comp_num_verts);
            n_1 = (float)(int)nVar4 / 16384.0;
            _comp_num_verts = _comp_num_verts + 2;
            mtx[0] = 0.0;
            m_1 = 0.0;
            mtx[1] = n_1;
          }
          fVar9 = nk_sqrt(n_1 * n_1 + m_1 * m_1);
          fVar10 = nk_sqrt(mtx[0] * mtx[0] + mtx[1] * mtx[1]);
          local_c8 = nk_tt_GetGlyphShape((nk_tt_fontinfo *)alloc_local,pnStack_28,(uint)(ushort)i_1,
                                         &tmp);
          if (0 < local_c8) {
            for (comp_verts._4_4_ = 0; comp_verts._4_4_ < local_c8;
                comp_verts._4_4_ = comp_verts._4_4_ + 1) {
              pnVar8 = tmp + comp_verts._4_4_;
              sVar1 = pnVar8->x;
              pnVar8->x = (short)(int)(fVar9 * (n_1 * (float)(int)sVar1 +
                                                mtx[0] * (float)(int)pnVar8->y + mtx[2]));
              pnVar8->y = (short)(int)(fVar10 * (m_1 * (float)(int)sVar1 +
                                                 mtx[1] * (float)(int)pnVar8->y + mtx[3]));
              sVar1 = pnVar8->cx;
              pnVar8->cx = (short)(int)(fVar9 * (n_1 * (float)(int)sVar1 +
                                                 mtx[0] * (float)(int)pnVar8->cy + mtx[2]));
              pnVar8->cy = (short)(int)(fVar10 * (m_1 * (float)(int)sVar1 +
                                                  mtx[1] * (float)(int)pnVar8->cy + mtx[3]));
            }
            pnVar8 = (nk_tt_vertex *)
                     (*pnStack_28->alloc)
                               (pnStack_28->userdata,(void *)0x0,(long)(iStack_5c + local_c8) * 10);
            if (pnVar8 == (nk_tt_vertex *)0x0) {
              if (_g != (nk_tt_vertex *)0x0) {
                (*pnStack_28->free)(pnStack_28->userdata,_g);
              }
              if (tmp != (nk_tt_vertex *)0x0) {
                (*pnStack_28->free)(pnStack_28->userdata,tmp);
              }
              return 0;
            }
            if (0 < iStack_5c) {
              nk_memcopy(pnVar8,_g,(long)iStack_5c * 10);
            }
            nk_memcopy(pnVar8 + iStack_5c,tmp,(long)local_c8 * 10);
            if (_g != (nk_tt_vertex *)0x0) {
              (*pnStack_28->free)(pnStack_28->userdata,_g);
            }
            _g = pnVar8;
            (*pnStack_28->free)(pnStack_28->userdata,tmp);
            iStack_5c = local_c8 + iStack_5c;
          }
          comp._0_4_ = i_1._2_2_ & 0x20;
        }
      }
      else if (endPtsOfContours._6_2_ < 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x2270,
                      "int nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *, struct nk_allocator *, int, struct nk_tt_vertex **)"
                     );
      }
    }
    else {
      i._3_1_ = 0;
      n = 0;
      start_off = 0;
      y = 0;
      data = (nk_byte *)((long)&vertices[1].x + (long)ins);
      nVar3 = nk_ttUSHORT((nk_byte *)
                          ((long)&vertices[1].x +
                          (long)((int)endPtsOfContours._6_2_ << 1) + (long)ins));
      j = (nk_int)nVar3;
      _more = (byte *)((long)&vertices[1].y +
                      (long)j + (long)((int)endPtsOfContours._6_2_ << 1) + (long)ins);
      nVar3 = nk_ttUSHORT(data + (long)((int)endPtsOfContours._6_2_ << 1) + -2);
      was_off = nVar3 + 1;
      next_move = was_off + endPtsOfContours._6_2_ * 2;
      _g = (nk_tt_vertex *)
           (*pnStack_28->alloc)(pnStack_28->userdata,(void *)0x0,(long)next_move * 10);
      if (_g == (nk_tt_vertex *)0x0) {
        return 0;
      }
      off = 0;
      i._2_1_ = 0;
      x = next_move - was_off;
      for (m = 0; m < was_off; m = m + 1) {
        if (i._2_1_ == 0) {
          i._3_1_ = *_more;
          pbVar2 = _more + 1;
          if ((i._3_1_ & 8) != 0) {
            i._2_1_ = _more[1];
            pbVar2 = _more + 2;
          }
        }
        else {
          i._2_1_ = i._2_1_ - 1;
          pbVar2 = _more;
        }
        _more = pbVar2;
        _g[x + m].type = i._3_1_;
      }
      cx = 0;
      for (m = 0; m < was_off; m = m + 1) {
        i._3_1_ = _g[x + m].type;
        if ((i._3_1_ & 2) == 0) {
          if ((i._3_1_ & 0x10) == 0) {
            cx = cx + (short)((ushort)*_more * 0x100 + (ushort)_more[1]);
            _more = _more + 2;
          }
        }
        else {
          comp._6_2_ = (ushort)*_more;
          if ((i._3_1_ & 0x10) == 0) {
            local_110 = -(int)(short)comp._6_2_;
          }
          else {
            local_110 = (int)(short)comp._6_2_;
          }
          cx = local_110 + cx;
          _more = _more + 1;
        }
        _g[x + m].x = (short)cx;
      }
      cy = 0;
      for (m = 0; m < was_off; m = m + 1) {
        i._3_1_ = _g[x + m].type;
        if ((i._3_1_ & 4) == 0) {
          if ((i._3_1_ & 0x20) == 0) {
            cy = cy + (short)((ushort)*_more * 0x100 + (ushort)_more[1]);
            _more = _more + 2;
          }
        }
        else {
          comp._4_2_ = (ushort)*_more;
          if ((i._3_1_ & 0x20) == 0) {
            local_114 = -(int)(short)comp._4_2_;
          }
          else {
            local_114 = (int)(short)comp._4_2_;
          }
          cy = local_114 + cy;
          _more = _more + 1;
        }
        _g[x + m].y = (short)cy;
      }
      iStack_5c = 0;
      points._0_4_ = 0;
      points._4_4_ = 0;
      sy = 0;
      sx = 0;
      scy = 0;
      scx = 0;
      for (m = 0; m < was_off; m = m + 1) {
        i._3_1_ = _g[x + m].type;
        cx = (nk_int)_g[x + m].x;
        cy = (nk_int)_g[x + m].y;
        if (off == m) {
          if (m != 0) {
            iStack_5c = stbtt__close_shape(_g,iStack_5c,start_off,y,scx,scy,points._4_4_,
                                           (nk_int)points,sx,sy);
          }
          y = (nk_int)(((i._3_1_ & 1) != 0 ^ 0xffU) & 1);
          if (y == 0) {
            scx = cx;
            scy = cy;
          }
          else {
            points._4_4_ = cx;
            points._0_4_ = cy;
            if ((_g[x + m + 1].type & 1) == 0) {
              scx = cx + _g[x + m + 1].x >> 1;
              scy = cy + _g[x + m + 1].y >> 1;
            }
            else {
              scx = (nk_int)_g[x + m + 1].x;
              scy = (nk_int)_g[x + m + 1].y;
              m = m + 1;
            }
          }
          lVar7 = (long)iStack_5c;
          iStack_5c = iStack_5c + 1;
          nk_tt_setvertex(_g + lVar7,'\x01',scx,scy,0,0);
          start_off = 0;
          nVar3 = nk_ttUSHORT(data + (n << 1));
          off = nVar3 + 1;
          n = n + 1;
        }
        else if ((i._3_1_ & 1) == 0) {
          if (start_off != 0) {
            lVar7 = (long)iStack_5c;
            iStack_5c = iStack_5c + 1;
            nk_tt_setvertex(_g + lVar7,'\x03',sx + cx >> 1,sy + cy >> 1,sx,sy);
          }
          sx = cx;
          sy = cy;
          start_off = 1;
        }
        else {
          if (start_off == 0) {
            lVar7 = (long)iStack_5c;
            iStack_5c = iStack_5c + 1;
            nk_tt_setvertex(_g + lVar7,'\x02',cx,cy,0,0);
          }
          else {
            lVar7 = (long)iStack_5c;
            iStack_5c = iStack_5c + 1;
            nk_tt_setvertex(_g + lVar7,'\x03',cx,cy,sx,sy);
          }
          start_off = 0;
        }
      }
      iStack_5c = stbtt__close_shape(_g,iStack_5c,start_off,y,scx,scy,points._4_4_,(nk_int)points,sx
                                     ,sy);
    }
    *ppnStack_38 = _g;
    info_local._4_4_ = iStack_5c;
  }
  return info_local._4_4_;
}

Assistant:

NK_INTERN int
nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *info, struct nk_allocator *alloc,
    int glyph_index, struct nk_tt_vertex **pvertices)
{
    nk_short numberOfContours;
    const nk_byte *endPtsOfContours;
    const nk_byte *data = info->data;
    struct nk_tt_vertex *vertices=0;
    int num_vertices=0;
    int g = nk_tt__GetGlyfOffset(info, glyph_index);
    *pvertices = 0;

    if (g < 0) return 0;
    numberOfContours = nk_ttSHORT(data + g);
    if (numberOfContours > 0) {
        nk_byte flags=0,flagcount;
        nk_int ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
        nk_int x,y,cx,cy,sx,sy, scx,scy;
        const nk_byte *points;
        endPtsOfContours = (data + g + 10);
        ins = nk_ttUSHORT(data + g + 10 + numberOfContours * 2);
        points = data + g + 10 + numberOfContours * 2 + 2 + ins;

        n = 1+nk_ttUSHORT(endPtsOfContours + numberOfContours*2-2);
        m = n + 2*numberOfContours;  /* a loose bound on how many vertices we might need */
        vertices = (struct nk_tt_vertex *)alloc->alloc(alloc->userdata, 0, (nk_size)m * sizeof(vertices[0]));
        if (vertices == 0)
            return 0;

        next_move = 0;
        flagcount=0;

        /* in first pass, we load uninterpreted data into the allocated array */
        /* above, shifted to the end of the array so we won't overwrite it when */
        /* we create our final data starting from the front */
        off = m - n; /* starting offset for uninterpreted data, regardless of how m ends up being calculated */

        /* first load flags */
        for (i=0; i < n; ++i) {
            if (flagcount == 0) {
                flags = *points++;
                if (flags & 8)
                    flagcount = *points++;
            } else --flagcount;
            vertices[off+i].type = flags;
        }

        /* now load x coordinates */
        x=0;
        for (i=0; i < n; ++i) {
            flags = vertices[off+i].type;
            if (flags & 2) {
                nk_short dx = *points++;
                x += (flags & 16) ? dx : -dx; /* ??? */
            } else {
                if (!(flags & 16)) {
                    x = x + (nk_short) (points[0]*256 + points[1]);
                    points += 2;
                }
            }
            vertices[off+i].x = (nk_short) x;
        }

        /* now load y coordinates */
        y=0;
        for (i=0; i < n; ++i) {
            flags = vertices[off+i].type;
            if (flags & 4) {
                nk_short dy = *points++;
                y += (flags & 32) ? dy : -dy; /* ??? */
            } else {
                if (!(flags & 32)) {
                    y = y + (nk_short) (points[0]*256 + points[1]);
                    points += 2;
                }
            }
            vertices[off+i].y = (nk_short) y;
        }

        /* now convert them to our format */
        num_vertices=0;
        sx = sy = cx = cy = scx = scy = 0;
        for (i=0; i < n; ++i)
        {
            flags = vertices[off+i].type;
            x     = (nk_short) vertices[off+i].x;
            y     = (nk_short) vertices[off+i].y;

            if (next_move == i) {
                if (i != 0)
                    num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

                /* now start the new one                */
                start_off = !(flags & 1);
                if (start_off) {
                    /* if we start off with an off-curve point, then when we need to find a point on the curve */
                    /* where we can start, and we need to save some state for when we wraparound. */
                    scx = x;
                    scy = y;
                    if (!(vertices[off+i+1].type & 1)) {
                        /* next point is also a curve point, so interpolate an on-point curve */
                        sx = (x + (nk_int) vertices[off+i+1].x) >> 1;
                        sy = (y + (nk_int) vertices[off+i+1].y) >> 1;
                    } else {
                        /* otherwise just use the next point as our start point */
                        sx = (nk_int) vertices[off+i+1].x;
                        sy = (nk_int) vertices[off+i+1].y;
                        ++i; /* we're using point i+1 as the starting point, so skip it */
                    }
                } else {
                    sx = x;
                    sy = y;
                }
                nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vmove,sx,sy,0,0);
                was_off = 0;
                next_move = 1 + nk_ttUSHORT(endPtsOfContours+j*2);
                ++j;
            } else {
                if (!(flags & 1))
                { /* if it's a curve */
                    if (was_off) /* two off-curve control points in a row means interpolate an on-curve midpoint */
                        nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
                    cx = x;
                    cy = y;
                    was_off = 1;
                } else {
                    if (was_off)
                        nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, x,y, cx, cy);
                    else nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vline, x,y,0,0);
                    was_off = 0;
                }
            }
        }
        num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
    } else if (numberOfContours == -1) {
        /* Compound shapes. */
        int more = 1;
        const nk_byte *comp = data + g + 10;
        num_vertices = 0;
        vertices = 0;

        while (more)
        {
            nk_ushort flags, gidx;
            int comp_num_verts = 0, i;
            struct nk_tt_vertex *comp_verts = 0, *tmp = 0;
            float mtx[6] = {1,0,0,1,0,0}, m, n;

            flags = (nk_ushort)nk_ttSHORT(comp); comp+=2;
            gidx = (nk_ushort)nk_ttSHORT(comp); comp+=2;

            if (flags & 2) { /* XY values */
                if (flags & 1) { /* shorts */
                    mtx[4] = nk_ttSHORT(comp); comp+=2;
                    mtx[5] = nk_ttSHORT(comp); comp+=2;
                } else {
                    mtx[4] = nk_ttCHAR(comp); comp+=1;
                    mtx[5] = nk_ttCHAR(comp); comp+=1;
                }
            } else {
                /* @TODO handle matching point */
                NK_ASSERT(0);
            }
            if (flags & (1<<3)) { /* WE_HAVE_A_SCALE */
                mtx[0] = mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = mtx[2] = 0;
            } else if (flags & (1<<6)) { /* WE_HAVE_AN_X_AND_YSCALE */
                mtx[0] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = mtx[2] = 0;
                mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
            } else if (flags & (1<<7)) { /* WE_HAVE_A_TWO_BY_TWO */
                mtx[0] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[2] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
            }

             /* Find transformation scales. */
            m = (float) NK_SQRT(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
            n = (float) NK_SQRT(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

             /* Get indexed glyph. */
            comp_num_verts = nk_tt_GetGlyphShape(info, alloc, gidx, &comp_verts);
            if (comp_num_verts > 0)
            {
                /* Transform vertices. */
                for (i = 0; i < comp_num_verts; ++i) {
                    struct nk_tt_vertex* v = &comp_verts[i];
                    short x,y;
                    x=v->x; y=v->y;
                    v->x = (short)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
                    v->y = (short)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
                    x=v->cx; y=v->cy;
                    v->cx = (short)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
                    v->cy = (short)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
                }
                /* Append vertices. */
                tmp = (struct nk_tt_vertex*)alloc->alloc(alloc->userdata, 0,
                    (nk_size)(num_vertices+comp_num_verts)*sizeof(struct nk_tt_vertex));
                if (!tmp) {
                    if (vertices) alloc->free(alloc->userdata, vertices);
                    if (comp_verts) alloc->free(alloc->userdata, comp_verts);
                    return 0;
                }
                if (num_vertices > 0) NK_MEMCPY(tmp, vertices, (nk_size)num_vertices*sizeof(struct nk_tt_vertex));
                NK_MEMCPY(tmp+num_vertices, comp_verts, (nk_size)comp_num_verts*sizeof(struct nk_tt_vertex));
                if (vertices) alloc->free(alloc->userdata,vertices);
                vertices = tmp;
                alloc->free(alloc->userdata,comp_verts);
                num_vertices += comp_num_verts;
            }
            /* More components ? */
            more = flags & (1<<5);
        }
    } else if (numberOfContours < 0) {
        /* @TODO other compound variations? */
        NK_ASSERT(0);
    } else {
        /* numberOfCounters == 0, do nothing */
    }
    *pvertices = vertices;
    return num_vertices;
}